

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_Shutdown(void)

{
  ImGui_ImplGlfw_Data *pIVar1;
  ImGuiIO *window;
  ImGuiMouseCursor cursor_n;
  GLFWcursor *unaff_retaddr;
  ImGuiIO *io;
  ImGui_ImplGlfw_Data *bd;
  int local_14;
  
  pIVar1 = ImGui_ImplGlfw_GetBackendData();
  window = ImGui::GetIO();
  if ((pIVar1->InstalledCallbacks & 1U) != 0) {
    ImGui_ImplGlfw_RestoreCallbacks((GLFWwindow *)window);
  }
  for (local_14 = 0; local_14 < 9; local_14 = local_14 + 1) {
    glfwDestroyCursor(unaff_retaddr);
  }
  window->BackendPlatformName = (char *)0x0;
  window->BackendPlatformUserData = (void *)0x0;
  IM_DELETE<ImGui_ImplGlfw_Data>((ImGui_ImplGlfw_Data *)0x530e9a);
  return;
}

Assistant:

void ImGui_ImplGlfw_Shutdown()
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    IM_ASSERT(bd != nullptr && "No platform backend to shutdown, or already shutdown?");
    ImGuiIO& io = ImGui::GetIO();

    if (bd->InstalledCallbacks)
        ImGui_ImplGlfw_RestoreCallbacks(bd->Window);

    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
        glfwDestroyCursor(bd->MouseCursors[cursor_n]);

    io.BackendPlatformName = nullptr;
    io.BackendPlatformUserData = nullptr;
    IM_DELETE(bd);
}